

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

int websocket_connect(char *address,websocket_settings_s settings)

{
  intptr_t iVar1;
  long lVar2;
  code **ppcVar3;
  undefined8 *puVar4;
  byte bVar5;
  http_settings_s in_stack_fffffffffffffef8;
  code *local_88;
  undefined8 local_80;
  code *pcStack_78;
  code *local_70;
  undefined8 *puStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined8 local_10;
  
  bVar5 = 0;
  puStack_68 = (undefined8 *)fio_malloc(0x30);
  *puStack_68 = settings.on_message;
  puStack_68[1] = settings.on_open;
  puStack_68[2] = settings.on_ready;
  puStack_68[3] = settings.on_shutdown;
  puStack_68[4] = settings.on_close;
  puStack_68[5] = settings.udata;
  local_80 = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  uStack_38 = 0;
  local_10 = 0;
  local_30 = 0;
  uStack_28 = 0;
  local_20 = 0;
  uStack_18 = 0;
  local_88 = on_websocket_http_connected;
  pcStack_78 = on_websocket_http_connected;
  local_70 = on_websocket_http_connection_finished;
  ppcVar3 = &local_88;
  puVar4 = (undefined8 *)&stack0xfffffffffffffef8;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *ppcVar3;
    ppcVar3 = ppcVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  iVar1 = http_connect(address,(char *)0x0,in_stack_fffffffffffffef8);
  return (int)iVar1;
}

Assistant:

int websocket_connect(const char *address, websocket_settings_s settings) {
  websocket_settings_s *s = fio_malloc(sizeof(*s));
  *s = settings;
  return http_connect(address, NULL, .on_request = on_websocket_http_connected,
                      .on_response = on_websocket_http_connected,
                      .on_finish = on_websocket_http_connection_finished,
                      .udata = s);
}